

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

int keyword(void)

{
  byte bVar1;
  ushort uVar2;
  char *cptr;
  uint uVar3;
  int c;
  ushort **ppuVar4;
  void *pvVar5;
  long lVar6;
  
  cptr = ::cptr;
  bVar1 = ::cptr[1];
  lVar6 = (long)(char)bVar1;
  ::cptr = ::cptr + 1;
  ppuVar4 = __ctype_b_loc();
  uVar2 = (*ppuVar4)[lVar6];
  if ((uVar2 >> 10 & 1) == 0) {
    ::cptr = cptr + 2;
    if (bVar1 < 0x3c) {
      if (bVar1 < 0x30) {
        if (bVar1 == 0x24) {
          return 8;
        }
        if (bVar1 == 0x25) {
          return 4;
        }
      }
      else {
        if (bVar1 == 0x30) {
          return 0;
        }
        if (bVar1 == 0x32) {
          return 3;
        }
      }
    }
    else if (bVar1 < 0x40) {
      if (bVar1 == 0x3c) {
        return 1;
      }
      if (bVar1 == 0x3e) {
        return 2;
      }
    }
    else {
      if (bVar1 == 0x40) {
        return 0xb;
      }
      if (bVar1 == 0x5c) {
        return 4;
      }
      if (bVar1 == 0x7b) {
        return 5;
      }
    }
  }
  else {
    cinc = 0;
    while (((uVar2 & 8) != 0 ||
           ((uVar3 = ((uint)lVar6 & 0xff) - 0x24, uVar3 < 0x3c &&
            ((0x800000000000401U >> ((ulong)uVar3 & 0x3f) & 1) != 0))))) {
      c = tolower((int)(char)lVar6);
      cachec(c);
      lVar6 = (long)::cptr[1];
      uVar2 = (*ppuVar4)[lVar6];
      ::cptr = ::cptr + 1;
    }
    cachec(0);
    pvVar5 = bsearch(cache,keywords,0xd,0x10,strcmp);
    if (pvVar5 != (void *)0x0) {
      return *(int *)((long)pvVar5 + 0xc);
    }
  }
  syntax_error(input_file->lineno,line,cptr);
  return 0;
}

Assistant:

int keyword()
{
  register int	c;
  char		*t_cptr = cptr;
  struct keyword	*key;

  c = *++cptr;
  if (isalpha(c)) {
    cinc = 0;
    while (isalnum(c) || c == '_' || c == '.' || c == '$') {
      cachec(tolower(c));
      c = *++cptr;
    }
    cachec(NUL);

    if ((key = bsearch(cache, keywords, sizeof(keywords)/sizeof(*key),
		       sizeof(*key),
		       (int (*)(const void *, const void *))strcmp)))
      return key->token;
  } else {
    ++cptr;
    if (c == '{') return (TEXT);
    if (c == '%' || c == '\\') return (MARK);
    if (c == '<') return (LEFT);
    if (c == '>') return (RIGHT);
    if (c == '0') return (TOKEN);
    if (c == '2') return (NONASSOC);
    if (c == '@') return (LOCATION);
    if (c == '$') return (UNION);
  }
  syntax_error(input_file->lineno, line, t_cptr);
  /*NOTREACHED*/
  return 0;
}